

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

bool __thiscall
google::protobuf::ServiceDescriptorProto::MergePartialFromCodedStream
          (ServiceDescriptorProto *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  uint8 *puVar3;
  void *pvVar4;
  bool bVar5;
  short extraout_AX;
  uint32 uVar6;
  uint uVar7;
  Type *this_00;
  pair<int,_int> pVar8;
  ServiceOptions *this_01;
  ulong extraout_RAX;
  UnknownFieldSet *unknown_fields;
  int byte_limit;
  int iVar9;
  uint tag;
  ulong uVar10;
  int local_5c;
  
  do {
    pbVar2 = input->buffer_;
    uVar6 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar6 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_00301b00;
      input->buffer_ = pbVar2 + 1;
      uVar10 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_00301b00:
      uVar6 = io::CodedInputStream::ReadTagFallback(input,uVar6);
      uVar10 = 0;
      if (uVar6 - 1 < 0x7f) {
        uVar10 = 0x100000000;
      }
      uVar10 = uVar6 | uVar10;
    }
    tag = (uint)uVar10;
    if ((uVar10 & 0x100000000) == 0) goto LAB_00301b98;
    uVar7 = (uint)(uVar10 >> 3) & 0x1fffffff;
    if (uVar7 == 2) {
      if ((char)uVar10 != '\x12') goto LAB_00301b98;
      this_00 = internal::RepeatedPtrFieldBase::
                Add<google::protobuf::RepeatedPtrField<google::protobuf::MethodDescriptorProto>::TypeHandler>
                          (&(this->method_).super_RepeatedPtrFieldBase,(Type *)0x0);
      puVar3 = input->buffer_;
      if ((puVar3 < input->buffer_end_) && (byte_limit = (int)(char)*puVar3, -1 < (char)*puVar3)) {
        input->buffer_ = puVar3 + 1;
        bVar5 = true;
      }
      else {
        byte_limit = io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar5 = -1 < byte_limit;
      }
      iVar9 = 6;
      if ((((bVar5) &&
           (pVar8 = io::CodedInputStream::IncrementRecursionDepthAndPushLimit(input,byte_limit),
           -1 < (long)pVar8)) &&
          (bVar5 = MethodDescriptorProto::MergePartialFromCodedStream(this_00,input), bVar5)) &&
         (bVar5 = io::CodedInputStream::DecrementRecursionDepthAndPopLimit(input,pVar8.first), bVar5
         )) goto LAB_00301bd8;
    }
    else if (uVar7 == 3) {
      if ((char)uVar10 == '\x1a') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
        if (this->options_ == (ServiceOptions *)0x0) {
          this_01 = (ServiceOptions *)operator_new(0x70);
          ServiceOptions::ServiceOptions(this_01);
          this->options_ = this_01;
        }
        MergePartialFromCodedStream();
        iVar9 = local_5c;
        if ((extraout_RAX & 1) == 0) goto LAB_00301bd8;
        goto LAB_00301bdb;
      }
LAB_00301b98:
      iVar9 = 7;
      if ((tag & 7) != 4 && tag != 0) {
        pvVar4 = (this->_internal_metadata_).
                 super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                 .ptr_;
        if (((ulong)pvVar4 & 1) == 0) {
          unknown_fields =
               internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&(this->_internal_metadata_).
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
        }
        else {
          unknown_fields = (UnknownFieldSet *)((ulong)pvVar4 & 0xfffffffffffffffe);
        }
        bVar5 = internal::WireFormat::SkipField(input,tag,unknown_fields);
        if (bVar5) goto LAB_00301bd8;
        iVar9 = 6;
      }
    }
    else {
      if ((uVar7 != 1) || (MergePartialFromCodedStream(), extraout_AX == 0)) goto LAB_00301b98;
      iVar9 = 6;
      if (extraout_AX == 1) goto LAB_00301bdb;
LAB_00301bd8:
      iVar9 = 0;
    }
LAB_00301bdb:
    if (iVar9 != 0) {
      return iVar9 != 6;
    }
  } while( true );
}

Assistant:

bool ServiceDescriptorProto::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:google.protobuf.ServiceDescriptorProto)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string name = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_name()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->name().data(), this->name().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.ServiceDescriptorProto.name");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .google.protobuf.MethodDescriptorProto method = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_method()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .google.protobuf.ServiceOptions options = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_options()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:google.protobuf.ServiceDescriptorProto)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:google.protobuf.ServiceDescriptorProto)
  return false;
#undef DO_
}